

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<char(&)[128],char,unsigned_int_const&>
          (String *__return_storage_ptr__,kj *this,char (*params) [128],char *params_1,
          uint *params_2)

{
  undefined1 local_51;
  kj *local_50;
  size_t local_48;
  CappedArray<char,_14UL> local_40;
  
  local_48 = strlen((char *)this);
  local_51 = (*params)[0];
  local_50 = this;
  _::Stringifier::operator*(&local_40,(Stringifier *)&_::STR,*(uint *)params_1);
  _::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,(_ *)&local_50,(ArrayPtr<const_char> *)&local_51,
             (FixedArray<char,_1UL> *)&local_40,(CappedArray<char,_14UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}